

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.cpp
# Opt level: O0

char * xe::getTestStatusCodeName(TestStatusCode code)

{
  char *pcStack_10;
  TestStatusCode code_local;
  
  switch(code) {
  case TESTSTATUSCODE_PASS:
    pcStack_10 = "Pass";
    break;
  case TESTSTATUSCODE_FAIL:
    pcStack_10 = "Fail";
    break;
  case TESTSTATUSCODE_QUALITY_WARNING:
    pcStack_10 = "QualityWarning";
    break;
  case TESTSTATUSCODE_COMPATIBILITY_WARNING:
    pcStack_10 = "CompatibilityWarning";
    break;
  case TESTSTATUSCODE_PENDING:
    pcStack_10 = "Pending";
    break;
  case TESTSTATUSCODE_RUNNING:
    pcStack_10 = "Running";
    break;
  case TESTSTATUSCODE_NOT_SUPPORTED:
    pcStack_10 = "NotSupported";
    break;
  case TESTSTATUSCODE_RESOURCE_ERROR:
    pcStack_10 = "ResourceError";
    break;
  case TESTSTATUSCODE_INTERNAL_ERROR:
    pcStack_10 = "InternalError";
    break;
  case TESTSTATUSCODE_CANCELED:
    pcStack_10 = "Canceled";
    break;
  case TESTSTATUSCODE_TIMEOUT:
    pcStack_10 = "Timeout";
    break;
  case TESTSTATUSCODE_CRASH:
    pcStack_10 = "Crash";
    break;
  case TESTSTATUSCODE_DISABLED:
    pcStack_10 = "Disabled";
    break;
  case TESTSTATUSCODE_TERMINATED:
    pcStack_10 = "Terminated";
    break;
  default:
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

const char* getTestStatusCodeName (TestStatusCode code)
{
	switch (code)
	{
		case TESTSTATUSCODE_PASS:					return "Pass";
		case TESTSTATUSCODE_FAIL:					return "Fail";
		case TESTSTATUSCODE_QUALITY_WARNING:		return "QualityWarning";
		case TESTSTATUSCODE_COMPATIBILITY_WARNING:	return "CompatibilityWarning";
		case TESTSTATUSCODE_PENDING:				return "Pending";
		case TESTSTATUSCODE_RUNNING:				return "Running";
		case TESTSTATUSCODE_NOT_SUPPORTED:			return "NotSupported";
		case TESTSTATUSCODE_RESOURCE_ERROR:			return "ResourceError";
		case TESTSTATUSCODE_INTERNAL_ERROR:			return "InternalError";
		case TESTSTATUSCODE_CANCELED:				return "Canceled";
		case TESTSTATUSCODE_TIMEOUT:				return "Timeout";
		case TESTSTATUSCODE_CRASH:					return "Crash";
		case TESTSTATUSCODE_DISABLED:				return "Disabled";
		case TESTSTATUSCODE_TERMINATED:				return "Terminated";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}